

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32ppcbe.c
# Opt level: O0

uint8_t ppc32_reloc_elf2vlink(uint8_t rtype,RelocInsert *ri)

{
  uint8_t uVar1;
  RelocInsert *in_RSI;
  byte in_DIL;
  uint8_t unaff_retaddr;
  RelocInsert *in_stack_ffffffffffffffe8;
  undefined6 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (in_DIL < 0x26) {
    uVar1 = setupRI(unaff_retaddr,
                    (ELF2vlink *)
                    CONCAT17(in_stack_ffffffffffffffff,CONCAT16(in_DIL,in_stack_fffffffffffffff8)),
                    in_RSI,in_stack_ffffffffffffffe8);
  }
  else if ((in_DIL < 0x65) || (0x74 < in_DIL)) {
    if ((in_DIL < 200) || (0xcb < in_DIL)) {
      if ((in_DIL < 0xd2) || (0xd5 < in_DIL)) {
        uVar1 = '\0';
      }
      else {
        uVar1 = setupRI(unaff_retaddr,
                        (ELF2vlink *)
                        CONCAT17(in_stack_ffffffffffffffff,
                                 CONCAT16(in_DIL,in_stack_fffffffffffffff8)),in_RSI,
                        in_stack_ffffffffffffffe8);
      }
    }
    else {
      uVar1 = setupRI(unaff_retaddr,
                      (ELF2vlink *)
                      CONCAT17(in_stack_ffffffffffffffff,CONCAT16(in_DIL,in_stack_fffffffffffffff8))
                      ,in_RSI,in_stack_ffffffffffffffe8);
    }
  }
  else {
    uVar1 = setupRI(unaff_retaddr,
                    (ELF2vlink *)
                    CONCAT17(in_stack_ffffffffffffffff,CONCAT16(in_DIL,in_stack_fffffffffffffff8)),
                    in_RSI,in_stack_ffffffffffffffe8);
  }
  return uVar1;
}

Assistant:

static uint8_t ppc32_reloc_elf2vlink(uint8_t rtype,struct RelocInsert *ri)
/* Determine vlink internal reloc type from ELF reloc type and fill in
   reloc-insert description informations.
   All fields of the RelocInsert structure are preset to zero. */
{
  /* Reloc conversion table for V.4-ABI @@@ not complete! */
  static struct ELF2vlink convertV4[] = {
    R_NONE,0,0,-1,
    R_ABS,0,32,-1,              /* R_PPC_ADDR32 */
    R_ABS,6,24,~3,              /* R_PPC_ADDR24 */
    R_ABS,0,16,-1,              /* R_PPC_ADDR16 */
    R_ABS,0,16,0xffff,          /* R_PPC_ADDR16_LO */
    R_ABS,0,16,0xffff0000,      /* R_PPC_ADDR16_HI */
    R_ABS,0,16,0,               /* R_PPC_ADDR16_HA */
    R_ABS,16,14,~3,             /* R_PPC_ADDR14 */
    R_ABS,16,14,~3,             /* R_PPC_ADDR14_BRTAKEN */
    R_ABS,16,14,~3,             /* R_PPC_ADDR14_BRNTAKEN */
    R_PC,6,24,~3,               /* R_PPC_REL24 */
    R_PC,16,14,~3,              /* R_PPC_REL14 */
    R_PC,16,14,~3,              /* R_PPC_REL14_BRTAKEN */
    R_PC,16,14,~3,              /* R_PPC_REL14_BRNTAKEN */
    R_GOT,0,16,-1,              /* R_PPC_GOT16 */
    R_GOT,0,16,0xffff,          /* R_PPC_GOT16_LO */
    R_GOT,0,16,0xffff0000,      /* R_PPC_GOT16_HI */
    R_GOT,0,16,0,               /* R_PPC_GOT16_HA */
    R_PLTPC,6,24,~3,            /* R_PPC_PLTREL24 */
    R_COPY,0,32,-1,             /* R_PPC_COPY */
    R_GLOBDAT,0,32,-1,          /* R_PPC_GLOB_DAT */
    R_JMPSLOT,0,64,-1,          /* R_PPC_JMP_SLOT */
    R_LOADREL,0,32,-1,          /* R_PPC_RELATIVE */
    R_LOCALPC,6,24,~3,          /* R_PPC_LOCAL24PC */
    R_UABS,0,32,-1,             /* R_PPC_UADDR32 */
    R_UABS,0,16,-1,             /* R_PPC_UADDR16 */
    R_PC,0,32,-1,               /* R_PPC_REL32 */
    R_PLT,0,32,-1,              /* R_PPC_PLT32 */
    R_PLTPC,0,32,-1,            /* R_PPC_PLTREL32 */
    R_PLT,0,16,0xffff,          /* R_PPC_PLT16_LO */
    R_PLT,0,16,0xffff0000,      /* R_PPC_PLT16_HI */
    R_PLT,0,16,0,               /* R_PPC_PLT16_HA */
    R_SD,0,16,-1,               /* R_PPC_SDAREL16 */
    R_SECOFF,0,16,-1,           /* R_PPC_SECTOFF */
    R_SECOFF,0,16,0xffff,       /* R_PPC_SECTOFF_LO */
    R_SECOFF,0,16,0xffff0000,   /* R_PPC_SECTOFF_HI */
    R_SECOFF,0,16,0,            /* R_PPC_SECTOFF_HA */
    R_ABS,0,30,~3               /* R_PPC_ADDR30 */
  };
  /* Reloc conversion table for PPC-EABI @@@ not complete! */
  static struct ELF2vlink convertEABI[] = {
    R_NONE,0,0,-1,              /* R_PPC_EMB_NADDR32 */
    R_NONE,0,0,-1,              /* R_PPC_EMB_NADDR16 */
    R_NONE,0,0,-1,              /* R_PPC_EMB_NADDR16_LO */
    R_NONE,0,0,-1,              /* R_PPC_EMB_NADDR16_HI */
    R_NONE,0,0,-1,              /* R_PPC_EMB_NADDR16_HA */
    R_NONE,0,0,-1,              /* R_PPC_EMB_SDAI16 */
    R_NONE,0,0,-1,              /* R_PPC_EMB_SDA2I16 */
    R_SD2,0,16,-1,              /* R_PPC_EMB_SDA2REL */
    R_SD21,16,16,-1,            /* R_PPC_EMB_SDA21 */
    R_NONE,0,0,-1,              /* R_PPC_EMB_MRKREF */
    R_NONE,0,0,-1,              /* R_PPC_EMB_RELSEC16 */
    R_NONE,0,0,-1,              /* R_PPC_EMB_RELST_LO */
    R_NONE,0,0,-1,              /* R_PPC_EMB_RELST_HI */
    R_NONE,0,0,-1,              /* R_PPC_EMB_RELST_HA */
    R_NONE,0,0,-1,              /* R_PPC_EMB_BIT_FLD */
    R_NONE,0,0,-1               /* R_PPC_EMB_RELSDA */
  };
  /* Reloc conversion table for MorphOS */
  static struct ELF2vlink convertMOS[] = {
    R_MOSDREL,0,16,-1,          /* R_PPC_MORPHOS_DREL */
    R_MOSDREL,0,16,0xffff,      /* R_PPC_MORPHOS_DREL_LO */
    R_MOSDREL,0,16,0xffff0000,  /* R_PPC_MORPHOS_DREL_HI */
    R_MOSDREL,0,16,0,           /* R_PPC_MORPHOS_DREL_HA */
  };
  /* Reloc conversion table for AmigaOS/PPC */
  static struct ELF2vlink convertAOS[] = {
    R_AOSBREL,0,16,-1,          /* R_PPC_AMIGAOS_BREL */
    R_AOSBREL,0,16,0xffff,      /* R_PPC_AMIGAOS_BREL_LO */
    R_AOSBREL,0,16,0xffff0000,  /* R_PPC_AMIGAOS_BREL_HI */
    R_AOSBREL,0,16,0,           /* R_PPC_AMIGAOS_BREL_HA */
  };

  static struct RelocInsert ri2;

  /* @@@ BRTAKEN/BRNTAKEN could get a special treatment by setting
     bsiz to 0 and use the next-pointer as a special function pointer */

  if (rtype <= R_PPC_ADDR30)
    return setupRI(rtype,convertV4,ri,&ri2);

  else if (rtype>=R_PPC_EMB_NADDR32 && rtype<=R_PPC_EMB_RELSDA)
    return setupRI(rtype-R_PPC_EMB_NADDR32,convertEABI,ri,&ri2);

  else if (rtype>=R_PPC_MORPHOS_DREL && rtype<=R_PPC_MORPHOS_DREL_HA)
    return setupRI(rtype-R_PPC_MORPHOS_DREL,convertMOS,ri,&ri2);

  else if (rtype>=R_PPC_AMIGAOS_BREL && rtype<=R_PPC_AMIGAOS_BREL_HA)
    return setupRI(rtype-R_PPC_AMIGAOS_BREL,convertAOS,ri,&ri2);

  return R_NONE;
}